

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vloc.cc
# Opt level: O1

ostream * tchecker::output(ostream *os,vloc_t *vloc,system_t *system)

{
  uint uVar1;
  pointer psVar2;
  long lVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar5 = (ulong)(vloc->super_loc_array_t).super_vloc_base_t.super_array_capacity_t<unsigned_int>.
                 _capacity;
  std::__ostream_insert<char,std::char_traits<char>>(os,"<",1);
  if (uVar5 != 0) {
    lVar6 = 0;
    do {
      if (lVar6 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>(os,",",1);
      }
      uVar1 = *(uint *)(&(vloc->super_loc_array_t)._fam.field_0x0 + lVar6);
      uVar4 = (ulong)uVar1;
      psVar2 = (system->super_locs_t)._locs.
               super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(system->super_locs_t)._locs.
                        super__Vector_base<std::shared_ptr<tchecker::system::loc_t>,_std::allocator<std::shared_ptr<tchecker::system::loc_t>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) <= uVar4) {
        __assert_fail("id < _locs.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/system/loc.hh"
                      ,0xc3,
                      "tchecker::system::loc_const_shared_ptr_t tchecker::system::locs_t::location(tchecker::loc_id_t) const"
                     );
      }
      lVar3 = (long)psVar2[uVar4].
                    super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (*(uint *)(lVar3 + 4) != uVar1) {
        __assert_fail("_locs[id]->id() == id",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/system/loc.hh"
                      ,0xc4,
                      "tchecker::system::loc_const_shared_ptr_t tchecker::system::locs_t::location(tchecker::loc_id_t) const"
                     );
      }
      this = psVar2[uVar4].super___shared_ptr<tchecker::system::loc_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this->_M_use_count = this->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this->_M_use_count = this->_M_use_count + 1;
        }
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (os,*(char **)(lVar3 + 8),*(long *)(lVar3 + 0x10));
      if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      }
      lVar6 = lVar6 + 4;
    } while (uVar5 << 2 != lVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,">",1);
  return os;
}

Assistant:

std::ostream & output(std::ostream & os, tchecker::vloc_t const & vloc, tchecker::system::system_t const & system)
{
  auto begin = vloc.begin(), end = vloc.end();
  os << "<";
  for (auto it = begin; it != end; ++it) {
    if (it != begin)
      os << ",";
    os << system.location(*it)->name();
  }
  os << ">";
  return os;
}